

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtSupportSize(word *t,int nVars)

{
  int iVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int SuppSize;
  int v;
  int nVars_local;
  word *t_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < nVars; local_18 = local_18 + 1) {
    iVar1 = Abc_TtHasVar(t,nVars,local_18);
    if (iVar1 != 0) {
      local_1c = local_1c + 1;
    }
  }
  return local_1c;
}

Assistant:

static inline int Abc_TtSupportSize( word * t, int nVars )
{
    int v, SuppSize = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_TtHasVar( t, nVars, v ) )
            SuppSize++;
    return SuppSize;
}